

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

CRef __thiscall Minisat::ClauseAllocator::alloc(ClauseAllocator *this,Clause *from)

{
  bool bVar1;
  int size;
  uint32_t size_00;
  Ref r;
  Clause *this_00;
  CRef cid;
  bool use_extra;
  Clause *from_local;
  ClauseAllocator *this_local;
  
  bVar1 = Clause::learnt(from);
  bVar1 = bVar1 || (this->extra_clause_field & 1U) != 0;
  size = Clause::size(from);
  size_00 = clauseWord32Size(size,bVar1);
  r = RegionAllocator<unsigned_int>::alloc(&this->ra,size_00);
  this_00 = lea(this,r);
  Clause::Clause(this_00,from,bVar1);
  return r;
}

Assistant:

CRef alloc(const Clause& from)
    {
        bool use_extra = from.learnt() | extra_clause_field;
        CRef cid       = ra.alloc(clauseWord32Size(from.size(), use_extra));
        new (lea(cid)) Clause(from, use_extra);
        return cid; }